

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImDrawListSplitter::~ImDrawListSplitter(ImDrawListSplitter *this)

{
  ClearFreeMemory(this);
  ImVector<ImDrawChannel>::~ImVector(&this->_Channels);
  return;
}

Assistant:

inline ~ImDrawListSplitter() { ClearFreeMemory(); }